

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenRefFuncSetFunc(BinaryenExpressionRef expr,char *funcName)

{
  Name local_28;
  
  if (expr->_id == RefFuncId) {
    wasm::Name::Name(&local_28,funcName);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("expression->is<RefFunc>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe38,"void BinaryenRefFuncSetFunc(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenRefFuncSetFunc(BinaryenExpressionRef expr, const char* funcName) {
  auto* expression = (Expression*)expr;
  assert(expression->is<RefFunc>());
  static_cast<RefFunc*>(expression)->func = funcName;
}